

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list_handler.c
# Opt level: O0

ion_err_t sldict_create_dictionary
                    (ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
                    ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
                    ion_dictionary_compare_t compare,ion_dictionary_handler_t *handler,
                    ion_dictionary_t *dictionary)

{
  ion_dictionary_parent_t *piVar1;
  ion_err_t result;
  int pden;
  int pnum;
  ion_dictionary_compare_t compare_local;
  ion_dictionary_size_t dictionary_size_local;
  ion_value_size_t value_size_local;
  ion_key_size_t key_size_local;
  ion_key_type_t key_type_local;
  ion_dictionary_id_t id_local;
  
  piVar1 = (ion_dictionary_parent_t *)malloc(0x38);
  dictionary->instance = piVar1;
  if (dictionary->instance == (ion_dictionary_parent_t *)0x0) {
    key_type_local._3_1_ = 6;
  }
  else {
    dictionary->instance->compare = compare;
    dictionary->instance->type = dictionary_type_skip_list_t;
    key_type_local._3_1_ =
         sl_initialize((ion_skiplist_t *)dictionary->instance,key_type,key_size,value_size,
                       dictionary_size,1,4);
    if ((key_type_local._3_1_ == key_type_numeric_signed >> 0x18) &&
       (handler != (ion_dictionary_handler_t *)0x0)) {
      dictionary->handler = handler;
    }
  }
  return key_type_local._3_1_;
}

Assistant:

ion_err_t
sldict_create_dictionary(
	ion_dictionary_id_t			id,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size,
	ion_dictionary_compare_t	compare,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary
) {
	UNUSED(id);

	int pnum, pden;

	dictionary->instance = malloc(sizeof(ion_skiplist_t));

	if (NULL == dictionary->instance) {
		return err_out_of_memory;
	}

	dictionary->instance->compare	= compare;
	dictionary->instance->type		= dictionary_type_skip_list_t;

	pnum							= 1;
	pden							= 4;

	ion_err_t result = sl_initialize((ion_skiplist_t *) dictionary->instance, key_type, key_size, value_size, dictionary_size, pnum, pden);

	if ((err_ok == result) && (NULL != handler)) {
		dictionary->handler = handler;
	}

	return result;
}